

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_clusters_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  vec<6U,_float> *p;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  uint32 uVar5;
  long lVar6;
  float *pfVar7;
  tile_details *ptVar8;
  uint16 uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float dist2;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  uVar15 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar19 = (ulong)(this->m_tiles).m_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar15;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar19 * data;
  uVar15 = ((data + 1) * uVar19) / uVar15;
  if (SUB164(auVar2 / auVar1,0) < (uint)uVar15) {
    uVar19 = SUB168(auVar2 / auVar1,0) & 0xffffffff;
    ptVar8 = (this->m_tiles).m_p;
    do {
      if (ptVar8[uVar19].pixels.m_size != 0) {
        p = &ptVar8[uVar19].color_endpoint;
        if (*(int *)((long)pData_ptr + 0x80) == 0) {
          lVar6 = *(long *)((long)pData_ptr + 0x68);
LAB_0017ca12:
          uVar13 = (ulong)*(uint *)((long)pData_ptr + 0x70);
        }
        else {
          uVar5 = fast_hash(p,0x18);
          uVar10 = uVar5 * -0x61c88647 >> (*(byte *)((long)pData_ptr + 0x78) & 0x1f);
          uVar13 = (ulong)uVar10;
          lVar6 = *(long *)((long)pData_ptr + 0x68);
          lVar12 = uVar13 * 0x20;
          if (*(char *)(lVar6 + 0x1c + lVar12) == '\0') goto LAB_0017ca12;
          fVar20 = *(float *)(lVar6 + lVar12);
          fVar21 = p->m_s[0];
          if ((fVar20 != fVar21) || (NAN(fVar20) || NAN(fVar21))) {
LAB_0017c98b:
            uVar14 = *(int *)((long)pData_ptr + 0x70) - 1;
            uVar13 = (ulong)(uVar10 - 1);
            if (uVar10 == 0) {
              uVar13 = (ulong)uVar14;
            }
            if ((uint)uVar13 != uVar10) {
              pfVar16 = (float *)((ulong)uVar14 * 0x20 + lVar6);
              pfVar7 = (float *)(lVar6 + lVar12) + -8;
              if (uVar10 == 0) {
                pfVar7 = pfVar16;
              }
              do {
                if (*(char *)(pfVar7 + 7) == '\0') break;
                iVar11 = (int)uVar13;
                if ((*pfVar7 == fVar21) && (!NAN(*pfVar7) && !NAN(fVar21))) {
                  uVar18 = 0xffffffffffffffff;
                  lVar12 = 0;
                  do {
                    if (uVar18 == 4) goto LAB_0017ca15;
                    lVar17 = uVar18 + 2;
                    uVar18 = uVar18 + 1;
                    lVar4 = lVar12 + 1;
                  } while ((pfVar7[lVar17] == p->m_s[lVar4]) &&
                          (lVar12 = lVar12 + 1, !NAN(pfVar7[lVar17]) && !NAN(p->m_s[lVar4])));
                  if (4 < uVar18) goto LAB_0017ca15;
                }
                uVar3 = iVar11 - 1;
                if (iVar11 == 0) {
                  uVar3 = uVar14;
                }
                uVar13 = (ulong)uVar3;
                pfVar7 = pfVar7 + -8;
                if (iVar11 == 0) {
                  pfVar7 = pfVar16;
                }
              } while (uVar3 != uVar10);
            }
            goto LAB_0017ca12;
          }
          uVar18 = 0xffffffffffffffff;
          lVar17 = 0;
          do {
            if (uVar18 == 4) goto LAB_0017ca15;
            fVar20 = *(float *)(lVar6 + lVar12 + 8 + uVar18 * 4);
            uVar18 = uVar18 + 1;
            lVar4 = lVar17 + 1;
          } while ((fVar20 == p->m_s[lVar4]) &&
                  (lVar17 = lVar17 + 1, !NAN(fVar20) && !NAN(p->m_s[lVar4])));
          if (uVar18 < 5) goto LAB_0017c98b;
        }
LAB_0017ca15:
        fVar20 = 0.0;
        lVar12 = 0;
        do {
          fVar21 = *(float *)(*(long *)((long)pData_ptr + 0x98) +
                              (ulong)*(uint *)(lVar6 + 0x18 + uVar13 * 0x20) * 0x18 + lVar12 * 4) -
                   p->m_s[lVar12];
          fVar20 = fVar20 + fVar21 * fVar21;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        uVar13 = 0;
        uVar9 = 0;
        if ((ulong)*(uint *)((long)pData_ptr + 0xa0) != 0) {
          pfVar7 = (float *)(*(long *)((long)pData_ptr + 0x98) + 0x14);
          uVar18 = 0;
          fVar21 = 1e+37;
          do {
            fVar23 = pfVar7[-5] - ptVar8[uVar19].color_endpoint.m_s[0];
            fVar22 = pfVar7[-4] - ptVar8[uVar19].color_endpoint.m_s[1];
            fVar22 = fVar22 * fVar22 + fVar23 * fVar23 + 0.0;
            if (((fVar22 <= fVar20) &&
                (fVar24 = pfVar7[-3] - ptVar8[uVar19].color_endpoint.m_s[2],
                fVar23 = pfVar7[-2] - ptVar8[uVar19].color_endpoint.m_s[3],
                fVar22 = fVar23 * fVar23 + fVar24 * fVar24 + fVar22, fVar22 <= fVar20)) &&
               (fVar24 = pfVar7[-1] - ptVar8[uVar19].color_endpoint.m_s[4],
               fVar23 = *pfVar7 - ptVar8[uVar19].color_endpoint.m_s[5],
               fVar22 = fVar23 * fVar23 + fVar24 * fVar24 + fVar22, fVar22 < fVar21)) {
              if ((fVar22 == 0.0) && (!NAN(fVar22))) {
                uVar9 = (uint16)uVar18;
                break;
              }
              uVar13 = uVar18 & 0xffffffff;
              fVar21 = fVar22;
            }
            uVar9 = (uint16)uVar13;
            uVar18 = uVar18 + 1;
            pfVar7 = pfVar7 + 6;
          } while (*(uint *)((long)pData_ptr + 0xa0) != uVar18);
        }
        ptVar8 = (this->m_tiles).m_p;
        ptVar8[uVar19].cluster_indices[0] = uVar9;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < (uVar15 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_clusters_task(uint64 data, void* pData_ptr)
    {
        tree_clusterizer<vec6F>* vq = (tree_clusterizer<vec6F>*)pData_ptr;
        const crnlib::vector<vec6F>& codebook = vq->get_codebook();
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        for (uint t = m_tiles.size() * data / num_tasks, tEnd = m_tiles.size() * (data + 1) / num_tasks; t < tEnd; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                const vec6F& v = m_tiles[t].color_endpoint;
                float node_dist = codebook[vq->get_node_index(v)].squared_distance(v);
                float best_dist = math::cNearlyInfinite;
                uint best_index = 0;
                for (uint i = 0; i < codebook.size(); i++)
                {
                    const vec6F& c = codebook[i];
                    float dist = 0;
                    float d0 = c[0] - v[0];
                    dist += d0 * d0;
                    float d1 = c[1] - v[1];
                    dist += d1 * d1;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d2 = c[2] - v[2];
                    dist += d2 * d2;
                    float d3 = c[3] - v[3];
                    dist += d3 * d3;
                    if (dist > node_dist)
                    {
                        continue;
                    }
                    float d4 = c[4] - v[4];
                    dist += d4 * d4;
                    float d5 = c[5] - v[5];
                    dist += d5 * d5;
                    if (dist < best_dist)
                    {
                        best_dist = dist;
                        best_index = i;
                        if (best_dist == 0.0f)
                        {
                            break;
                        }
                    }
                }
                m_tiles[t].cluster_indices[cColor] = best_index;
            }
        }
    }